

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteFlat<duckdb::string_t,duckdb::date_t,duckdb::date_t,duckdb::BinaryStandardOperatorWrapper,duckdb::DateTruncBinaryOperator,bool,false,true>
               (Vector *left,Vector *right,Vector *result,idx_t count,bool fun)

{
  byte bVar1;
  bool bVar2;
  string_t *count_00;
  TemplatedValidityMask<unsigned_long> *in_RCX;
  Vector *in_RDX;
  byte in_R8B;
  ValidityMask *result_validity;
  date_t *result_data;
  date_t *rdata;
  string_t *ldata;
  bool in_stack_0000007f;
  ValidityMask *in_stack_00000080;
  idx_t in_stack_00000088;
  date_t *in_stack_00000090;
  date_t *in_stack_00000098;
  string_t *in_stack_000000a0;
  Vector *in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffd8;
  
  bVar1 = in_R8B & 1;
  count_00 = FlatVector::GetData<duckdb::string_t>((Vector *)0xc27edb);
  FlatVector::GetData<duckdb::date_t>((Vector *)0xc27eea);
  bVar2 = ConstantVector::IsNull((Vector *)0xc27ef9);
  if (bVar2) {
    duckdb::Vector::SetVectorType((VectorType)in_RDX);
    duckdb::ConstantVector::SetNull(in_RDX,true);
  }
  else {
    duckdb::Vector::SetVectorType((VectorType)in_RDX);
    FlatVector::GetData<duckdb::date_t>((Vector *)0xc27f38);
    FlatVector::Validity((Vector *)0xc27f47);
    bVar2 = BinaryStandardOperatorWrapper::AddsNulls();
    if (bVar2) {
      FlatVector::Validity((Vector *)0xc27f6b);
      TemplatedValidityMask<unsigned_long>::Copy
                (in_RCX,(TemplatedValidityMask<unsigned_long> *)
                        CONCAT17(bVar1,in_stack_ffffffffffffffd8),(idx_t)count_00);
    }
    else {
      FlatVector::Validity((Vector *)0xc27f92);
      FlatVector::SetValidity(in_stack_ffffffffffffffb0,(ValidityMask *)in_RDX);
    }
    ExecuteFlatLoop<duckdb::string_t,duckdb::date_t,duckdb::date_t,duckdb::BinaryStandardOperatorWrapper,duckdb::DateTruncBinaryOperator,bool,false,true>
              (in_stack_000000a0,in_stack_00000098,in_stack_00000090,in_stack_00000088,
               in_stack_00000080,in_stack_0000007f);
  }
  return;
}

Assistant:

static void ExecuteFlat(Vector &left, Vector &right, Vector &result, idx_t count, FUNC fun) {
		auto ldata = FlatVector::GetData<LEFT_TYPE>(left);
		auto rdata = FlatVector::GetData<RIGHT_TYPE>(right);

		if ((LEFT_CONSTANT && ConstantVector::IsNull(left)) || (RIGHT_CONSTANT && ConstantVector::IsNull(right))) {
			// either left or right is constant NULL: result is constant NULL
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(result, true);
			return;
		}

		result.SetVectorType(VectorType::FLAT_VECTOR);
		auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
		auto &result_validity = FlatVector::Validity(result);
		if (LEFT_CONSTANT) {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(right), count);
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(right));
			}
		} else if (RIGHT_CONSTANT) {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(left), count);
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(left));
			}
		} else {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(left), count);
				if (result_validity.AllValid()) {
					result_validity.Copy(FlatVector::Validity(right), count);
				} else {
					result_validity.Combine(FlatVector::Validity(right), count);
				}
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(left));
				result_validity.Combine(FlatVector::Validity(right), count);
			}
		}
		ExecuteFlatLoop<LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE, OPWRAPPER, OP, FUNC, LEFT_CONSTANT, RIGHT_CONSTANT>(
		    ldata, rdata, result_data, count, result_validity, fun);
	}